

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::operator()
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>
           *this,char value)

{
  basic_format_specs<char> *spec;
  arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *local_18;
  char local_10;
  undefined3 uStack_f;
  
  spec = *(basic_format_specs<char> **)(this + 0x10);
  _local_10 = CONCAT31(uStack_f,value);
  local_18 = this;
  if ((spec->type_ == '\0') || (spec->type_ == 'c')) {
    if (((spec->super_align_spec).align_ == ALIGN_NUMERIC) || (spec->flags_ != 0)) {
      error_handler::on_error((error_handler *)&local_18,"invalid format specifier for char");
    }
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::internal::arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::char_writer>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,1,*(align_spec **)(this + 0x10),(char_writer)value);
  }
  else {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_int<char,fmt::v5::basic_format_specs<char>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,value,spec);
  }
  return (type)*(basic_buffer<char> **)this;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, iterator>::type
      operator()(T value) {
    // MSVC2013 fails to compile separate overloads for bool and char_type so
    // use std::is_same instead.
    if (std::is_same<T, bool>::value) {
      if (specs_.type_)
        return (*this)(value ? 1 : 0);
      write(value != 0);
    } else if (std::is_same<T, char_type>::value) {
      internal::handle_char_specs(
        specs_, char_spec_handler(*this, static_cast<char_type>(value)));
    } else {
      writer_.write_int(value, specs_);
    }
    return out();
  }